

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int *piVar1;
  UChar32 *pUVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  UChar32 UVar7;
  int iVar8;
  undefined8 uStack_38;
  UErrorCode status;
  
  if (((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
      (other != (UChar32 *)0x0)) && ((this->fFlags & 1) == 0)) {
    uStack_38 = 0;
    ensureBufferCapacity(this,otherLen + this->len,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      piVar1 = this->list;
      pUVar2 = this->buffer;
      iVar5 = *piVar1;
      UVar7 = *other;
      uVar4 = 0;
      iVar6 = 1;
      iVar8 = 1;
LAB_0019ccbd:
      do {
      } while (3 < (byte)polarity);
      iVar3 = (int)uVar4;
      switch(polarity) {
      case '\0':
        if (iVar5 < UVar7) {
          if ((iVar3 < 1) || (pUVar2[uVar4 - 1] < iVar5)) {
            uVar4 = (ulong)(iVar3 + 1);
            pUVar2[iVar3] = iVar5;
            iVar5 = piVar1[iVar6];
          }
          else {
            uVar4 = (ulong)(iVar3 - 1);
            iVar5 = pUVar2[uVar4];
            if (pUVar2[uVar4] < piVar1[iVar6]) {
              iVar5 = piVar1[iVar6];
            }
          }
          iVar6 = iVar6 + 1;
          polarity = 1;
          goto LAB_0019ccbd;
        }
        if (UVar7 < iVar5) {
          if ((iVar3 < 1) || (pUVar2[uVar4 - 1] < UVar7)) {
            uVar4 = (ulong)(iVar3 + 1);
            pUVar2[iVar3] = UVar7;
            UVar7 = other[iVar8];
          }
          else {
            uVar4 = (ulong)(iVar3 - 1);
            UVar7 = pUVar2[uVar4];
            if (pUVar2[uVar4] < other[iVar8]) {
              UVar7 = other[iVar8];
            }
          }
          iVar8 = iVar8 + 1;
          polarity = 2;
          goto LAB_0019ccbd;
        }
        if (iVar5 == 0x110000) {
LAB_0019ce7e:
          pUVar2[iVar3] = 0x110000;
          this->len = iVar3 + 1;
          swapBuffers(this);
          releasePattern(this);
          return;
        }
        if ((iVar3 < 1) || (pUVar2[uVar4 - 1] < iVar5)) {
          uVar4 = (ulong)(iVar3 + 1);
          pUVar2[iVar3] = iVar5;
          iVar5 = piVar1[iVar6];
        }
        else {
          uVar4 = (ulong)(iVar3 - 1);
          iVar5 = pUVar2[uVar4];
          if (pUVar2[uVar4] < piVar1[iVar6]) {
            iVar5 = piVar1[iVar6];
          }
        }
        iVar6 = iVar6 + 1;
        break;
      case '\x01':
        if (iVar5 < UVar7) {
          uVar4 = (ulong)(iVar3 + 1);
          pUVar2[iVar3] = iVar5;
          iVar5 = piVar1[iVar6];
          polarity = 0;
          iVar6 = iVar6 + 1;
          goto LAB_0019ccbd;
        }
        if (iVar5 <= UVar7) {
          if (iVar5 == 0x110000) goto LAB_0019ce7e;
          iVar5 = piVar1[iVar6];
          UVar7 = other[iVar8];
          polarity = 2;
          iVar6 = iVar6 + 1;
          iVar8 = iVar8 + 1;
          goto LAB_0019ccbd;
        }
        break;
      case '\x02':
        if (UVar7 < iVar5) {
          uVar4 = (ulong)(iVar3 + 1);
          pUVar2[iVar3] = UVar7;
          UVar7 = other[iVar8];
          polarity = 0;
          iVar8 = iVar8 + 1;
        }
        else if (iVar5 < UVar7) {
          iVar5 = piVar1[iVar6];
          polarity = 3;
          iVar6 = iVar6 + 1;
        }
        else {
          if (iVar5 == 0x110000) goto LAB_0019ce7e;
          iVar5 = piVar1[iVar6];
          UVar7 = other[iVar8];
          polarity = 1;
          iVar6 = iVar6 + 1;
          iVar8 = iVar8 + 1;
        }
        goto LAB_0019ccbd;
      case '\x03':
        if (UVar7 <= iVar5) {
          if (iVar5 != 0x110000) goto LAB_0019cd73;
          goto LAB_0019ce7e;
        }
        iVar5 = UVar7;
        if (UVar7 == 0x110000) goto LAB_0019ce7e;
LAB_0019cd73:
        pUVar2[iVar3] = iVar5;
        iVar5 = piVar1[iVar6];
        UVar7 = other[iVar8];
        polarity = 0;
        uVar4 = (ulong)(iVar3 + 1);
        iVar6 = iVar6 + 1;
        iVar8 = iVar8 + 1;
        goto LAB_0019ccbd;
      }
      UVar7 = other[iVar8];
      polarity = 3;
      iVar8 = iVar8 + 1;
      goto LAB_0019ccbd;
    }
  }
  return;
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}